

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O1

void mpz_import(__mpz_struct *r,size_t count,int order,size_t size,int endian,size_t nails,void *src
               )

{
  bool bVar1;
  uint uVar2;
  mp_ptr pmVar3;
  long lVar4;
  long lVar5;
  uint extraout_EDX;
  long lVar6;
  undefined1 *puVar7;
  long unaff_RBX;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  mp_limb_t mVar11;
  size_t sVar12;
  undefined1 *puVar13;
  long lVar14;
  ulong uVar15;
  byte *pbVar16;
  ulong uVar17;
  long lVar18;
  
  if (nails != 0) {
    mpz_import_cold_1();
    if (nails == 0) {
      uVar8 = *(uint *)(unaff_RBX + 4);
      if (uVar8 == 0) {
        uVar10 = 0;
      }
      else {
        uVar2 = -uVar8;
        if (0 < (int)uVar8) {
          uVar2 = uVar8;
        }
        uVar9 = (ulong)uVar2;
        uVar17 = (size + uVar9 * 8) - 9;
        uVar10 = *(ulong *)(*(long *)(unaff_RBX + 8) + -8 + uVar9 * 8);
        do {
          uVar17 = uVar17 + 1;
          bVar1 = 0xff < uVar10;
          uVar10 = uVar10 >> 8;
        } while (bVar1);
        uVar10 = uVar17 / size;
        if (r == (__mpz_struct *)0x0) {
          r = (__mpz_struct *)(*gmp_allocate_func)(uVar10 * size);
        }
        uVar8 = -(uint)(endian == 0) | endian;
        lVar6 = 0;
        if (uVar8 != extraout_EDX) {
          lVar6 = size * 2;
        }
        lVar4 = -lVar6;
        if (extraout_EDX != 1) {
          lVar4 = lVar6;
        }
        if (size <= uVar17) {
          lVar5 = 0;
          lVar6 = (uVar10 - 1) * size;
          if (extraout_EDX != 1) {
            lVar6 = lVar5;
          }
          puVar13 = (undefined1 *)((long)&r->_mp_alloc + lVar6);
          puVar7 = puVar13 + (size - 1);
          if (uVar8 != 1) {
            puVar7 = puVar13;
          }
          lVar18 = size + (size == 0);
          lVar14 = 0;
          uVar17 = 0;
          uVar15 = 0;
          lVar6 = lVar18;
          do {
            do {
              if ((lVar14 == 0) && (lVar14 = 8, lVar5 < (long)uVar9)) {
                uVar17 = *(ulong *)(*(long *)(unaff_RBX + 8) + lVar5 * 8);
                lVar5 = lVar5 + 1;
              }
              *puVar7 = (char)uVar17;
              uVar17 = uVar17 >> 8;
              lVar14 = lVar14 + -1;
              puVar7 = puVar7 + -(long)(int)uVar8;
              lVar6 = lVar6 + -1;
            } while (lVar6 != 0);
            uVar15 = uVar15 + 1;
            puVar7 = puVar7 + lVar4;
            lVar6 = lVar18;
          } while (uVar15 < uVar10);
        }
      }
      if ((ulong *)count != (ulong *)0x0) {
        *(ulong *)count = uVar10;
      }
      return;
    }
    mpz_export_cold_1();
    r->_mp_alloc = 0;
    r->_mp_size = 0;
    r->_mp_d = &mpz_init::dummy_limb;
    r[1]._mp_alloc = 0;
    r[1]._mp_size = 1;
    r[1]._mp_d = &mpz_init::dummy_limb;
    pmVar3 = mpz_realloc(r + 1,1);
    *pmVar3 = 1;
    return;
  }
  uVar8 = -(uint)(endian == 0) | endian;
  lVar6 = size * 2;
  if (uVar8 == order) {
    lVar6 = 0;
  }
  lVar5 = -lVar6;
  lVar4 = (count - 1) * size;
  if (order != 1) {
    lVar5 = lVar6;
    lVar4 = 0;
  }
  pbVar16 = (byte *)(lVar4 + (long)src) + (size - 1);
  if (uVar8 != 1) {
    pbVar16 = (byte *)(lVar4 + (long)src);
  }
  uVar10 = size * count + 7 >> 3;
  if ((long)r->_mp_alloc < (long)uVar10) {
    pmVar3 = mpz_realloc(r,uVar10);
  }
  else {
    pmVar3 = r->_mp_d;
  }
  if (count == 0) {
    mVar11 = 0;
    lVar6 = 0;
  }
  else {
    lVar6 = 0;
    lVar4 = 0;
    mVar11 = 0;
    do {
      sVar12 = size;
      if (size != 0) {
        do {
          lVar14 = lVar4 + 1;
          mVar11 = (ulong)*pbVar16 << ((byte)((int)lVar4 << 3) & 0x3f) | mVar11;
          lVar4 = lVar14;
          if (lVar14 == 8) {
            pmVar3[lVar6] = mVar11;
            lVar6 = lVar6 + 1;
            mVar11 = 0;
            lVar4 = 0;
          }
          pbVar16 = pbVar16 + -(long)(int)uVar8;
          sVar12 = sVar12 - 1;
        } while (sVar12 != 0);
      }
      pbVar16 = pbVar16 + lVar5;
      count = count - 1;
    } while (count != 0);
  }
  if (mVar11 == 0) {
    if (0 < lVar6) {
      do {
        if (pmVar3[lVar6 + -1] != 0) goto LAB_005ee40a;
        bVar1 = 1 < lVar6;
        lVar6 = lVar6 + -1;
      } while (bVar1);
      lVar6 = 0;
    }
  }
  else {
    pmVar3[lVar6] = mVar11;
    lVar6 = lVar6 + 1;
  }
LAB_005ee40a:
  r->_mp_size = (int)lVar6;
  return;
}

Assistant:

void
mpz_import (mpz_t r, size_t count, int order, size_t size, int endian,
	    size_t nails, const void *src)
{
  const unsigned char *p;
  ptrdiff_t word_step;
  mp_ptr rp;
  mp_size_t rn;

  /* The current (partial) limb. */
  mp_limb_t limb;
  /* The number of bytes already copied to this limb (starting from
     the low end). */
  size_t bytes;
  /* The index where the limb should be stored, when completed. */
  mp_size_t i;

  if (nails != 0)
    gmp_die ("mpz_import: Nails not supported.");

  assert (order == 1 || order == -1);
  assert (endian >= -1 && endian <= 1);

  if (endian == 0)
    endian = gmp_detect_endian ();

  p = (unsigned char *) src;

  word_step = (order != endian) ? 2 * size : 0;

  /* Process bytes from the least significant end, so point p at the
     least significant word. */
  if (order == 1)
    {
      p += size * (count - 1);
      word_step = - word_step;
    }

  /* And at least significant byte of that word. */
  if (endian == 1)
    p += (size - 1);

  rn = (size * count + sizeof(mp_limb_t) - 1) / sizeof(mp_limb_t);
  rp = MPZ_REALLOC (r, rn);

  for (limb = 0, bytes = 0, i = 0; count > 0; count--, p += word_step)
    {
      size_t j;
      for (j = 0; j < size; j++, p -= (ptrdiff_t) endian)
	{
	  limb |= (mp_limb_t) *p << (bytes++ * CHAR_BIT);
	  if (bytes == sizeof(mp_limb_t))
	    {
	      rp[i++] = limb;
	      bytes = 0;
	      limb = 0;
	    }
	}
    }
  assert (i + (bytes > 0) == rn);
  if (limb != 0)
    rp[i++] = limb;
  else
    i = mpn_normalized_size (rp, i);

  r->_mp_size = i;
}